

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_api.c
# Opt level: O0

MPP_RET h265e_deinit(void *ctx)

{
  H265eCtx *p;
  void *ctx_local;
  
  if ((h265e_debug & 1) != 0) {
    _mpp_log_l(4,"h265e_api","enter ctx %p\n","h265e_deinit",ctx);
  }
  if (ctx == (void *)0x0) {
    _mpp_log_l(2,"h265e_api","invalid NULL ctx\n","h265e_deinit");
    ctx_local._4_4_ = MPP_ERR_NULL_PTR;
  }
  else {
    h265e_deinit_extra_info(*(void **)((long)ctx + 0x5018));
    if (*(long *)((long)ctx + 0x5018) != 0) {
      mpp_osal_free("h265e_deinit",*(void **)((long)ctx + 0x5018));
    }
    *(undefined8 *)((long)ctx + 0x5018) = 0;
    if (*(long *)((long)ctx + 0x5020) != 0) {
      mpp_osal_free("h265e_deinit",*(void **)((long)ctx + 0x5020));
    }
    *(undefined8 *)((long)ctx + 0x5020) = 0;
    if (*(long *)((long)ctx + 0x5028) != 0) {
      mpp_packet_deinit((MppPacket *)((long)ctx + 0x5028));
    }
    h265e_dpb_deinit(*(H265eDpb **)((long)ctx + 0x5008));
    if ((h265e_debug & 1) != 0) {
      _mpp_log_l(4,"h265e_api","leave ctx %p\n","h265e_deinit",ctx);
    }
    ctx_local._4_4_ = MPP_OK;
  }
  return ctx_local._4_4_;
}

Assistant:

static MPP_RET h265e_deinit(void *ctx)
{
    H265eCtx *p = (H265eCtx *)ctx;

    h265e_dbg_func("enter ctx %p\n", ctx);

    if (ctx == NULL) {
        mpp_err_f("invalid NULL ctx\n");
        return MPP_ERR_NULL_PTR;
    }

    h265e_deinit_extra_info(p->extra_info);

    MPP_FREE(p->extra_info);
    MPP_FREE(p->param_buf);
    if (p->packeted_param)
        mpp_packet_deinit(&p->packeted_param);

    h265e_dpb_deinit(p->dpb);

    h265e_dbg_func("leave ctx %p\n", ctx);
    return MPP_OK;
}